

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O1

void Ssw_ManRollForward(Ssw_Man_t *p,int nFrames)

{
  undefined1 *puVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *pAVar5;
  int iVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswFilter.c"
                  ,100,"void Ssw_ManRollForward(Ssw_Man_t *, int)");
  }
  pAVar5 = p->pAig;
  if (0 < pAVar5->nRegs) {
    iVar3 = 0;
    do {
      uVar9 = pAVar5->nTruePos + iVar3;
      if (((int)uVar9 < 0) || (pAVar5->vCos->nSize <= (int)uVar9)) goto LAB_005e41bc;
      iVar6 = pAVar5->nTruePis + iVar3;
      pvVar2 = pAVar5->vCos->pArray[uVar9];
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
           (ulong)((p->pPatWords[iVar6 >> 5] >> ((byte)iVar6 & 0x1f) & 1) << 5);
      iVar3 = iVar3 + 1;
      pAVar5 = p->pAig;
    } while (iVar3 < pAVar5->nRegs);
  }
  iVar3 = 1;
  if (1 < nFrames) {
    iVar3 = nFrames;
  }
  iVar6 = 0;
  do {
    puVar1 = &p->pAig->pConst1->field_0x18;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
    pAVar5 = p->pAig;
    if (0 < pAVar5->nTruePis) {
      lVar11 = 0;
      do {
        if (pAVar5->vCis->nSize <= lVar11) goto LAB_005e41bc;
        pvVar2 = pAVar5->vCis->pArray[lVar11];
        uVar9 = Aig_ManRandom(0);
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf | (ulong)((uVar9 & 1) << 5);
        lVar11 = lVar11 + 1;
        pAVar5 = p->pAig;
      } while (lVar11 < pAVar5->nTruePis);
    }
    pAVar5 = p->pAig;
    if (0 < pAVar5->nRegs) {
      iVar4 = 0;
      do {
        uVar9 = pAVar5->nTruePos + iVar4;
        if (((int)uVar9 < 0) || (pAVar5->vCos->nSize <= (int)uVar9)) goto LAB_005e41bc;
        uVar10 = pAVar5->nTruePis + iVar4;
        if (((int)uVar10 < 0) || (pAVar5->vCis->nSize <= (int)uVar10)) goto LAB_005e41bc;
        pvVar2 = pAVar5->vCis->pArray[uVar10];
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
             (ulong)((uint)*(undefined8 *)((long)pAVar5->vCos->pArray[uVar9] + 0x18) & 0x20);
        iVar4 = iVar4 + 1;
        pAVar5 = p->pAig;
      } while (iVar4 < pAVar5->nRegs);
    }
    pVVar8 = p->pAig->vObjs;
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar11];
        if (pvVar2 != (void *)0x0) {
          if (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7) {
            *(ulong *)((long)pvVar2 + 0x18) =
                 *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
                 (ulong)((((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                          *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          >> 5) & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                                  *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) +
                                           0x18) >> 5) & 1) << 5);
          }
        }
        lVar11 = lVar11 + 1;
        pVVar8 = p->pAig->vObjs;
      } while (lVar11 < pVVar8->nSize);
    }
    pVVar8 = p->pAig->vCos;
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar11];
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
             (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 5 ^
                     *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
        lVar11 = lVar11 + 1;
        pVVar8 = p->pAig->vCos;
      } while (lVar11 < pVVar8->nSize);
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != iVar3);
  pAVar5 = p->pAig;
  if (0 < pAVar5->nRegs) {
    pVVar8 = pAVar5->vCos;
    iVar3 = 0;
    do {
      uVar9 = pAVar5->nTruePos + iVar3;
      if (((int)uVar9 < 0) || (pVVar8->nSize <= (int)uVar9)) {
LAB_005e41bc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar7 = pAVar5->nTruePis + iVar3;
      iVar6 = (int)uVar7 >> 5;
      uVar10 = p->pPatWords[iVar6];
      uVar7 = uVar7 & 0x1f;
      if (((uVar10 >> (sbyte)uVar7 ^ *(uint *)((long)pVVar8->pArray[uVar9] + 0x18) >> 5) & 1) != 0)
      {
        p->pPatWords[iVar6] = uVar10 ^ 1 << uVar7;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < pAVar5->nRegs);
  }
  return;
}

Assistant:

void Ssw_ManRollForward( Ssw_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i;
    assert( nFrames > 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
    // simulate the timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Aig_ManRandom(0) & 1;
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
    }
    // record the new pattern
    Saig_ManForEachLi( p->pAig, pObj, i )
        if ( pObj->fMarkB ^ Abc_InfoHasBit(p->pPatWords, Saig_ManPiNum(p->pAig) + i) )
            Abc_InfoXorBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
}